

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::PostprocessHelper_CreateMeshDataArray
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray)

{
  CAMFImporter_NodeElement *pCVar1;
  value_type pCVar2;
  bool bVar3;
  reference ppCVar4;
  size_type sVar5;
  reference ppCVar6;
  reference ppCVar7;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar8;
  CAMFImporter_NodeElement *vtx;
  iterator __end3;
  iterator __begin3;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range3;
  CAMFImporter_NodeElement *vn_child;
  iterator __end1_1;
  iterator __begin1_1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1_1;
  CAMFImporter_NodeElement *ne_child;
  const_iterator __end1;
  const_iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  size_t col_idx;
  CAMFImporter_NodeElement_Vertices *vn;
  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  *pVertexColorArray_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray_local;
  CAMFImporter_NodeElement_Mesh *pNodeElement_local;
  AMFImporter *this_local;
  
  col_idx = 0;
  plVar8 = &(pNodeElement->super_CAMFImporter_NodeElement).Child;
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     (plVar8);
  ne_child = (CAMFImporter_NodeElement *)
             std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                       (plVar8);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&ne_child), bVar3) {
    ppCVar4 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    if ((*ppCVar4)->Type == ENET_Vertices) {
      col_idx = (size_t)*ppCVar4;
    }
    std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  }
  if (col_idx != 0) {
    sVar5 = std::__cxx11::
            list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::size
                      ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                        *)(col_idx + 0x38));
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (pVertexCoordinateArray,sVar5);
    sVar5 = std::__cxx11::
            list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::size
                      ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                        *)(col_idx + 0x38));
    std::vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
    ::resize(pVertexColorArray,sVar5);
    __range1 = (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)0x0;
    __end1_1 = std::__cxx11::
               list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                         ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                           *)(col_idx + 0x38));
    vn_child = (CAMFImporter_NodeElement *)
               std::__cxx11::
               list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                         ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                           *)(col_idx + 0x38));
    while (bVar3 = std::operator!=(&__end1_1,(_Self *)&vn_child), bVar3) {
      ppCVar6 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1_1);
      pCVar1 = *ppCVar6;
      if (pCVar1->Type == ENET_Vertex) {
        ppCVar7 = std::
                  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  ::operator[](pVertexColorArray,(size_type)__range1);
        *ppCVar7 = (value_type)0x0;
        plVar8 = &pCVar1->Child;
        __end3 = std::__cxx11::
                 list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
                 begin(plVar8);
        vtx = (CAMFImporter_NodeElement *)
              std::__cxx11::
              list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                        (plVar8);
        while (bVar3 = std::operator!=(&__end3,(_Self *)&vtx), bVar3) {
          ppCVar6 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end3);
          pCVar2 = (value_type)*ppCVar6;
          if ((pCVar2->super_CAMFImporter_NodeElement).Type == ENET_Coordinates) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (pVertexCoordinateArray,(value_type *)&pCVar2->Composed);
          }
          else if ((pCVar2->super_CAMFImporter_NodeElement).Type == ENET_Color) {
            ppCVar7 = std::
                      vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                      ::operator[](pVertexColorArray,(size_type)__range1);
            *ppCVar7 = pCVar2;
          }
          std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end3);
        }
        __range1 = (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)
                   ((long)&(__range1->
                           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1);
      }
      std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1_1);
    }
  }
  return;
}

Assistant:

void AMFImporter::PostprocessHelper_CreateMeshDataArray(const CAMFImporter_NodeElement_Mesh& pNodeElement, std::vector<aiVector3D>& pVertexCoordinateArray,
														std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray) const
{
    CAMFImporter_NodeElement_Vertices* vn = nullptr;
    size_t col_idx;

	// All data stored in "vertices", search for it.
	for(CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Vertices) vn = (CAMFImporter_NodeElement_Vertices*)ne_child;
	}

	// If "vertices" not found then no work for us.
	if(vn == nullptr) return;

	pVertexCoordinateArray.reserve(vn->Child.size());// all coordinates stored as child and we need to reserve space for future push_back's.
	pVertexColorArray.resize(vn->Child.size());// colors count equal vertices count.
	col_idx = 0;
	// Inside vertices collect all data and place to arrays
	for(CAMFImporter_NodeElement* vn_child: vn->Child)
	{
		// vertices, colors
		if(vn_child->Type == CAMFImporter_NodeElement::ENET_Vertex)
		{
			// by default clear color for current vertex
			pVertexColorArray[col_idx] = nullptr;

			for(CAMFImporter_NodeElement* vtx: vn_child->Child)
			{
				if(vtx->Type == CAMFImporter_NodeElement::ENET_Coordinates)
				{
					pVertexCoordinateArray.push_back(((CAMFImporter_NodeElement_Coordinates*)vtx)->Coordinate);

					continue;
				}

				if(vtx->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					pVertexColorArray[col_idx] = (CAMFImporter_NodeElement_Color*)vtx;

					continue;
				}
			}// for(CAMFImporter_NodeElement* vtx: vn_child->Child)

			col_idx++;
		}// if(vn_child->Type == CAMFImporter_NodeElement::ENET_Vertex)
	}// for(CAMFImporter_NodeElement* vn_child: vn->Child)
}